

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall
PartitionTable::partition_enumerator
          (PartitionTable *this,function<void_(unsigned_char,_unsigned_long,_unsigned_long)> *fn)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t __args_2;
  int local_1c;
  int i;
  function<void_(unsigned_char,_unsigned_long,_unsigned_long)> *fn_local;
  PartitionTable *this_local;
  
  local_1c = 0;
  do {
    if (3 < local_1c) {
      return;
    }
    iVar1 = Entry::type(this->_table + local_1c);
    if (iVar1 == 0) {
      uVar2 = Entry::size(this->_table + local_1c);
      if (uVar2 != 0) goto LAB_00119a20;
    }
    else {
LAB_00119a20:
      iVar1 = Entry::type(this->_table + local_1c);
      uVar2 = Entry::start(this->_table + local_1c);
      __args_2 = Entry::size(this->_table + local_1c);
      std::function<void_(unsigned_char,_unsigned_long,_unsigned_long)>::operator()
                (fn,(uchar)iVar1,uVar2,__args_2);
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void partition_enumerator(std::function<void(uint8_t,uint64_t,uint64_t)> fn)
    {
        for (int i=0 ; i<4 ; i++)
            if (_table[i].type() || _table[i].size())
                fn(_table[i].type(), _table[i].start(), _table[i].size());
    }